

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t header_old_tar(archive_read *a,tar *tar,archive_entry *entry,void *h)

{
  wchar_t wVar1;
  char *in_RCX;
  archive_entry *in_RDX;
  archive_read *in_RSI;
  wchar_t err2;
  wchar_t err;
  archive_entry_header_ustar *header;
  uint in_stack_ffffffffffffffc8;
  wchar_t local_4;
  
  local_4 = L'\0';
  wVar1 = _archive_entry_copy_pathname_l
                    (in_RDX,in_RCX,(size_t)in_RCX,
                     (archive_string_conv *)(ulong)in_stack_ffffffffffffffc8);
  if ((wVar1 == L'\0') ||
     (local_4 = set_conversion_failed_error(in_RSI,(archive_string_conv *)in_RDX,in_RCX),
     local_4 != L'\xffffffe2')) {
    wVar1 = header_common((archive_read *)entry,(tar *)h,(archive_entry *)header,_err2);
    if (wVar1 < local_4) {
      local_4 = wVar1;
    }
    in_RSI->bidders[0].init =
         (_func_int_archive_read_filter_ptr *)(-(long)in_RSI->bidders[0].name & 0x1ff);
  }
  return local_4;
}

Assistant:

static int
header_old_tar(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h)
{
	const struct archive_entry_header_ustar	*header;
	int err = ARCHIVE_OK, err2;

	/* Copy filename over (to ensure null termination). */
	header = (const struct archive_entry_header_ustar *)h;
	if (archive_entry_copy_pathname_l(entry,
	    header->name, sizeof(header->name), tar->sconv) != 0) {
		err = set_conversion_failed_error(a, tar->sconv, "Pathname");
		if (err == ARCHIVE_FATAL)
			return (err);
	}

	/* Grab rest of common fields */
	err2 = header_common(a, tar, entry, h);
	if (err > err2)
		err = err2;

	tar->entry_padding = 0x1ff & (-tar->entry_bytes_remaining);
	return (err);
}